

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

ostream * argparse::operator<<(ostream *stream,ArgumentParser *parser)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  size_t __wide;
  const_reference pvVar4;
  reference pAVar5;
  Argument *mOptionalArgument;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3_2;
  Argument *mPositionalArgument;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3_1;
  Argument *argument;
  const_iterator __end3;
  const_iterator __begin3;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3;
  size_t tLongestArgumentLength;
  sentry local_28 [8];
  sentry sen;
  ArgumentParser *parser_local;
  ostream *stream_local;
  
  std::ostream::sentry::sentry(local_28,stream);
  bVar2 = std::ostream::sentry::operator_cast_to_bool(local_28);
  if (bVar2) {
    std::ios_base::setf((ios_base *)(stream + *(long *)(*(long *)stream + -0x18)),_S_left);
    poVar3 = std::operator<<(stream,"Usage: ");
    poVar3 = std::operator<<(poVar3,(string *)parser);
    std::operator<<(poVar3," [options] ");
    __wide = ArgumentParser::get_length_of_longest_argument(parser);
    __end3 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                       (&parser->mPositionalArguments);
    argument = (Argument *)
               std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::end
                         (&parser->mPositionalArguments);
    while (bVar2 = std::operator==(&__end3,(_Self *)&argument), ((bVar2 ^ 0xffU) & 1) != 0) {
      pAVar5 = std::_List_const_iterator<argparse::Argument>::operator*(&__end3);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&pAVar5->mNames);
      poVar3 = std::operator<<(stream,(string *)pvVar4);
      std::operator<<(poVar3," ");
      std::_List_const_iterator<argparse::Argument>::operator++(&__end3);
    }
    std::operator<<(stream,"\n\n");
    bVar2 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::empty
                      (&parser->mPositionalArguments);
    if (!bVar2) {
      std::operator<<(stream,"Positional arguments:\n");
    }
    __end3_1 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                         (&parser->mPositionalArguments);
    mPositionalArgument =
         (Argument *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::end
                   (&parser->mPositionalArguments);
    while (bVar2 = std::operator==(&__end3_1,(_Self *)&mPositionalArgument),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pAVar5 = std::_List_const_iterator<argparse::Argument>::operator*(&__end3_1);
      std::ios_base::width((ios_base *)(stream + *(long *)(*(long *)stream + -0x18)),__wide);
      operator<<(stream,pAVar5);
      std::_List_const_iterator<argparse::Argument>::operator++(&__end3_1);
    }
    bVar2 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::empty
                      (&parser->mOptionalArguments);
    if (!bVar2) {
      bVar2 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::empty
                        (&parser->mPositionalArguments);
      pcVar1 = "\n\n";
      if (bVar2) {
        pcVar1 = "\a";
      }
      poVar3 = std::operator<<(stream,pcVar1 + 1);
      std::operator<<(poVar3,"Optional arguments:\n");
    }
    __end3_2 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                         (&parser->mOptionalArguments);
    mOptionalArgument =
         (Argument *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::end
                   (&parser->mOptionalArguments);
    while (bVar2 = std::operator==(&__end3_2,(_Self *)&mOptionalArgument),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pAVar5 = std::_List_const_iterator<argparse::Argument>::operator*(&__end3_2);
      std::ios_base::width((ios_base *)(stream + *(long *)(*(long *)stream + -0x18)),__wide);
      operator<<(stream,pAVar5);
      std::_List_const_iterator<argparse::Argument>::operator++(&__end3_2);
    }
  }
  std::ostream::sentry::~sentry(local_28);
  return stream;
}

Assistant:

auto operator<<(std::ostream &stream, const ArgumentParser &parser)
      -> std::ostream & {
    if (auto sen = std::ostream::sentry(stream)) {
      stream.setf(std::ios_base::left);
      stream << "Usage: " << parser.mProgramName << " [options] ";
      size_t tLongestArgumentLength = parser.get_length_of_longest_argument();

      for (const auto &argument : parser.mPositionalArguments) {
        stream << argument.mNames.front() << " ";
      }
      stream << "\n\n";

      if (!parser.mPositionalArguments.empty())
        stream << "Positional arguments:\n";

      for (const auto &mPositionalArgument : parser.mPositionalArguments) {
        stream.width(tLongestArgumentLength);
        stream << mPositionalArgument;
      }

      if (!parser.mOptionalArguments.empty())
        stream << (parser.mPositionalArguments.empty() ? "" : "\n")
               << "Optional arguments:\n";

      for (const auto &mOptionalArgument : parser.mOptionalArguments) {
        stream.width(tLongestArgumentLength);
        stream << mOptionalArgument;
      }
    }

    return stream;
  }